

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void different_stl_string_pointers_are_not_equal(void)

{
  string *psVar1;
  string *this;
  Constraint *constraint;
  allocator local_12;
  allocator local_11;
  
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)psVar1,"bob",&local_11);
  bob_pointer_abi_cxx11_ = psVar1;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this,"alice",&local_12);
  psVar1 = bob_pointer_abi_cxx11_;
  alice_pointer_abi_cxx11_ = this;
  constraint = (Constraint *)
               cgreen::create_not_equal_to_string_constraint((string *)this,"alice_pointer");
  cgreen::assert_that_<std::__cxx11::string*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x7d,"bob_pointer",psVar1,constraint);
  return;
}

Assistant:

Ensure(different_stl_string_pointers_are_not_equal) {
    bob_pointer = new std::string("bob");
    alice_pointer = new std::string("alice");

    assert_that(bob_pointer, is_not_equal_to_string(alice_pointer));
}